

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O0

void __thiscall E64::blitter_ic::terminal_cursor_decrease(blitter_ic *this,uint8_t no)

{
  ushort uVar1;
  uint16_t uVar2;
  long lVar3;
  byte in_SIL;
  long in_RDI;
  
  lVar3 = *(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140;
  *(short *)(lVar3 + 0x34) = *(short *)(lVar3 + 0x34) + -1;
  uVar1 = *(ushort *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x34);
  uVar2 = blit_t::get_tiles((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
  if ((int)(uVar2 - 1) < (int)(uint)uVar1) {
    uVar2 = blit_t::get_tiles((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
    *(uint16_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x34) = uVar2 - 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x3f) = 1;
  }
  else {
    *(undefined1 *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x3f) = 0;
  }
  return;
}

Assistant:

void E64::blitter_ic::terminal_cursor_decrease(uint8_t no)
{
	blit[no].cursor_position--;
	if (blit[no].cursor_position > blit[no].get_tiles() - 1) {
		blit[no].cursor_position = blit[no].get_tiles() - 1;
		blit[no].cursor_big_move = true;
	} else {
		blit[no].cursor_big_move = false;
	}
}